

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_mdef.c
# Opt level: O0

int bin_mdef_ciphone_id_nocase(bin_mdef_t *m,char *ciphone)

{
  int32 iVar1;
  int32 iVar2;
  int local_2c;
  int c;
  int high;
  int mid;
  int low;
  char *ciphone_local;
  bin_mdef_t *m_local;
  
  high = 0;
  iVar1 = m->n_ciphone;
  while( true ) {
    local_2c = iVar1;
    if (local_2c <= high) {
      return -1;
    }
    iVar1 = (high + local_2c) / 2;
    iVar2 = strcmp_nocase(ciphone,m->ciname[iVar1]);
    if (iVar2 == 0) break;
    if (0 < iVar2) {
      high = iVar1 + 1;
      iVar1 = local_2c;
    }
  }
  return iVar1;
}

Assistant:

int
bin_mdef_ciphone_id_nocase(bin_mdef_t * m, const char *ciphone)
{
    int low, mid, high;

    /* Exact binary search on m->ciphone */
    low = 0;
    high = m->n_ciphone;
    while (low < high) {
        int c;

        mid = (low + high) / 2;
        c = strcmp_nocase(ciphone, m->ciname[mid]);
        if (c == 0)
            return mid;
        else if (c > 0)
            low = mid + 1;
        else
            high = mid;
    }
    return -1;
}